

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string * nlohmann::detail::exception::name(string *__return_storage_ptr__,string *ename,int id_)

{
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  uint __val;
  uint __len;
  string __str;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,"[json.exception.",ename);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_80 = *puVar7;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar7;
    local_90 = (ulong *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  __val = -id_;
  if (0 < id_) {
    __val = id_;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar9;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00190464;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00190464;
      }
      if (uVar6 < 10000) goto LAB_00190464;
      uVar9 = uVar9 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_00190464:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)(id_ >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)id_ >> 0x1f) + (long)local_70),__len,__val);
  uVar9 = 0xf;
  if (local_90 != &local_80) {
    uVar9 = local_80;
  }
  if (uVar9 < (ulong)(local_68 + local_88)) {
    uVar9 = 0xf;
    if (local_70 != local_60) {
      uVar9 = local_60[0];
    }
    if ((ulong)(local_68 + local_88) <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
      goto LAB_001904f0;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
LAB_001904f0:
  local_b0 = &local_a0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar5[3];
  }
  else {
    local_a0 = *puVar1;
    local_b0 = (undefined8 *)*puVar5;
  }
  local_a8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string name(const std::string& ename, int id_) {
		return "[json.exception." + ename + "." + std::to_string(id_) + "] ";
	}